

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

void __thiscall HighsLp::userCostScale(HighsLp *this,HighsInt user_cost_scale)

{
  pointer pdVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = user_cost_scale - this->user_cost_scale_;
  if (iVar3 != 0) {
    dVar4 = ldexp(1.0,iVar3);
    iVar3 = this->num_col_;
    if (0 < (long)iVar3) {
      pdVar1 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = 0;
      do {
        pdVar1[lVar2] = pdVar1[lVar2] * dVar4;
        lVar2 = lVar2 + 1;
      } while (iVar3 != lVar2);
    }
    this->user_cost_scale_ = user_cost_scale;
  }
  return;
}

Assistant:

void HighsLp::userCostScale(const HighsInt user_cost_scale) {
  const HighsInt dl_user_cost_scale = user_cost_scale - this->user_cost_scale_;
  if (!dl_user_cost_scale) return;
  double dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
    this->col_cost_[iCol] *= dl_user_cost_scale_value;
  this->user_cost_scale_ = user_cost_scale;
}